

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  size_t __size;
  char *__ptr;
  _Self __tmp;
  long *plVar5;
  ulong uVar6;
  char local_488 [8];
  char r_buf [1024];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  string b;
  string serial_port;
  
  getComList_abi_cxx11_();
  b.field_2._8_8_ = &serial_port._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&b.field_2 + 8),"");
  l.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)&b._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &l.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size,"USB","");
  iVar1 = 0;
  if ((char *)r_buf._1016_8_ != r_buf + 0x3f8) {
    iVar1 = 0;
    plVar5 = (long *)r_buf._1016_8_;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)plVar5[2],plVar5[3]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar4 = std::__cxx11::string::find
                        ((char *)(plVar5 + 2),
                         l.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size,0);
      if (lVar4 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found\n",6);
        std::__cxx11::string::_M_assign((string *)(b.field_2._M_local_buf + 8));
        iVar1 = iVar1 + 1;
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)(r_buf + 0x3f8));
  }
  if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"find serial port, OK!!!",0x17);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"serial_port == ",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)b.field_2._8_8_,
                        (long)serial_port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (1 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"find more than one serial port,please choose check!!!",0x35);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"not found right serial port,please check!!!",0x2b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  bzero(local_488,0x400);
  IMU_JY61::fd = IMU_JY61::uart_open(IMU_JY61::fd,(char *)b.field_2._8_8_);
  if (IMU_JY61::fd == -1) {
    __ptr = "uart_open error\n";
    __size = 0x10;
  }
  else {
    iVar1 = IMU_JY61::uart_set(IMU_JY61::fd,0x1c200,8,'N',1);
    if (iVar1 == -1) {
      __ptr = "uart set failed!\n";
      __size = 0x11;
    }
    else {
      IMU_JY61::getTime();
      while (uVar2 = IMU_JY61::recv_data(IMU_JY61::fd,local_488,0x2c), uVar2 != 0xffffffff) {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            IMU_JY61::ParseData(local_488[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        usleep(1000);
      }
      __ptr = "uart read failed!\n";
      __size = 0x12;
    }
  }
  fwrite(__ptr,__size,1,_stderr);
  exit(1);
}

Assistant:

int main(void)
{
    //qxiaofan added
    //自动识别串口
    list<string> l = getComList();

    list<string>::iterator it = l.begin();

    std::string serial_port= "";
    std::string b = "USB";
    string::size_type idx;

    int success_num = 0;

    while (it != l.end()) {
        cout << *it << endl;

        idx = it->find(b);
        if(idx != string::npos)
        {
            cout<<"found\n";
            success_num++;
            serial_port = *it;
        }
        it++;
    }

    if(success_num == 1)
    {
        std::cout<<"find serial port, OK!!!"<<std::endl;
        std::cout<<"serial_port == "<<serial_port<<std::endl;
    }

    if(success_num > 1)
    {
        std::cout<<"find more than one serial port,please choose check!!!"<<std::endl;
    }

    if(success_num < 1)
    {
        std::cout<<"not found right serial port,please check!!!"<<std::endl;
    }
    //qxiaofan ended

    char r_buf[1024];
    bzero(r_buf,1024);

    //src
    //fd = uart_open(fd,"/dev/ttyUSB1");/*串口号/dev/ttySn,USB口号/dev/ttyUSBn */

    fd = uart_open(fd,serial_port.c_str());

    if(fd == -1)
    {
        fprintf(stderr,"uart_open error\n");
        exit(EXIT_FAILURE);
    }

    if(uart_set(fd,BAUD,8,'N',1) == -1)
    {
        fprintf(stderr,"uart set failed!\n");
        exit(EXIT_FAILURE);
    }

    //src
	//FILE *fp;
	//fp = fopen("Record.txt","w");

	long time_base = getTime();
    while(1)
    {
        ret = recv_data(fd,r_buf,44);
        if(ret == -1)
        {
            fprintf(stderr,"uart read failed!\n");
            exit(EXIT_FAILURE);
        }
		for (int i=0;i<ret;i++) {
		    //fprintf(fp,"%2X ",r_buf[i]);
		    //std::cout<<"r_buf["<<i<<"] == "<<r_buf[i]<<std::endl;
		    ParseData(r_buf[i]);
		}
        usleep(1000);
    }

    ret = uart_close(fd);
    if(ret == -1)
    {
        fprintf(stderr,"uart_close error\n");
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}